

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DLevelScript::Unlink(DLevelScript *this)

{
  DACSThinker *pointing;
  DACSThinker *controller;
  DLevelScript *this_local;
  
  pointing = ::TObjPtr::operator_cast_to_DACSThinker_((TObjPtr *)&DACSThinker::ActiveThinker);
  if (pointing->LastScript == this) {
    pointing->LastScript = this->prev;
    GC::WriteBarrier((DObject *)pointing,&this->prev->super_DObject);
  }
  if (pointing->Scripts == this) {
    pointing->Scripts = this->next;
    GC::WriteBarrier((DObject *)pointing,&this->next->super_DObject);
  }
  if (this->prev != (DLevelScript *)0x0) {
    this->prev->next = this->next;
    GC::WriteBarrier(&this->prev->super_DObject,&this->next->super_DObject);
  }
  if (this->next != (DLevelScript *)0x0) {
    this->next->prev = this->prev;
    GC::WriteBarrier(&this->next->super_DObject,&this->prev->super_DObject);
  }
  return;
}

Assistant:

void DLevelScript::Unlink ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	if (controller->LastScript == this)
	{
		controller->LastScript = prev;
		GC::WriteBarrier(controller, prev);
	}
	if (controller->Scripts == this)
	{
		controller->Scripts = next;
		GC::WriteBarrier(controller, next);
	}
	if (prev)
	{
		prev->next = next;
		GC::WriteBarrier(prev, next);
	}
	if (next)
	{
		next->prev = prev;
		GC::WriteBarrier(next, prev);
	}
}